

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O3

MPP_RET h264e_vepu_buf_deinit(HalH264eVepuBufs *bufs)

{
  long lVar1;
  
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_deinit",bufs);
  }
  if (bufs->cabac_table != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(bufs->cabac_table,"h264e_vepu_buf_deinit");
  }
  if (bufs->nal_size_table != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(bufs->nal_size_table,"h264e_vepu_buf_deinit");
  }
  lVar1 = 8;
  do {
    if (bufs->frm_buf[lVar1 + -8] != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(bufs->frm_buf[lVar1 + -8],"h264e_vepu_buf_deinit");
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x19);
  if (bufs->group != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(bufs->group);
  }
  memset(bufs,0,200);
  bufs->cabac_init_idc = -1;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_deinit",bufs);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_buf_deinit(HalH264eVepuBufs *bufs)
{
    RK_S32 i;

    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (bufs->cabac_table)
        mpp_buffer_put(bufs->cabac_table);

    if (bufs->nal_size_table)
        mpp_buffer_put(bufs->nal_size_table);

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(bufs->frm_buf); i++) {
        if (bufs->frm_buf[i])
            mpp_buffer_put(bufs->frm_buf[i]);
    }

    if (bufs->group)
        mpp_buffer_group_put(bufs->group);

    memset(bufs, 0, sizeof(*bufs));
    bufs->cabac_init_idc = -1;

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return MPP_OK;
}